

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_3_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)dstride;
  if (block_width == 8) {
    for (lVar6 = 0; lVar6 < block_height; lVar6 = lVar6 + 2) {
      uVar2 = *(undefined8 *)(in + 4);
      uVar3 = *(undefined8 *)(in + 0x90);
      uVar4 = *(undefined8 *)(in + 0x94);
      *(undefined8 *)dest = *(undefined8 *)in;
      *(undefined8 *)((long)dest + 8) = uVar2;
      puVar1 = (undefined8 *)((long)dest + lVar5 * 2);
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      in = in + 0x120;
      dest = (void *)((long)dest + lVar5 * 4);
    }
  }
  else {
    for (lVar6 = 0; lVar6 < block_height; lVar6 = lVar6 + 4) {
      uVar2 = *(undefined8 *)(in + 0x90);
      uVar3 = *(undefined8 *)(in + 0x120);
      uVar4 = *(undefined8 *)(in + 0x1b0);
      *(undefined8 *)dest = *(undefined8 *)in;
      *(undefined8 *)((long)dest + lVar5 * 2) = uVar2;
      *(undefined8 *)((long)dest + lVar5 * 4) = uVar3;
      *(undefined8 *)((long)dest + lVar5 * 6) = uVar4;
      in = in + 0x240;
      dest = (void *)((long)dest + lVar5 * 8);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_3)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;
  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  }
}